

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::SimpleTimeZone::getOffsetFromLocal
          (SimpleTimeZone *this,UDate date,int32_t nonExistingTimeOpt,int32_t duplicatedTimeOpt,
          int32_t *rawOffsetGMT,int32_t *savingsDST,UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  double local_70;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int32_t doy_unused;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_40 = savingsDST;
  iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[8])();
  *rawOffsetGMT = iVar2;
  local_48 = rawOffsetGMT;
  dVar5 = uprv_floor_63(date / 86400000.0);
  local_38 = (ulong)(uint)(int)(date - dVar5 * 86400000.0);
  Grego::dayToFields(dVar5,&year,&month,&dom,&dow,&doy_unused);
  iVar2 = 0;
  if ((year & 3U) == 0) {
    uVar4 = year * -0x3d70a3d7 + 0x51eb850;
    iVar2 = 0xc;
    if ((uVar4 >> 2 | year * 0x40000000) < 0x28f5c29) {
      iVar2 = 0xc;
      if (0xa3d70a < (uVar4 >> 4 | year * -0x70000000)) {
        iVar2 = 0;
      }
    }
  }
  iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                    (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)(byte)dow,
                     local_38,(ulong)(uint)(int)(char)Grego::MONTH_LENGTH[iVar2 + month],status);
  iVar2 = *local_48;
  *local_40 = iVar3 - iVar2;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  local_70 = date;
  if (iVar3 - iVar2 < 1) {
    bVar1 = true;
    if (((duplicatedTimeOpt & 3U) == 1) ||
       (((duplicatedTimeOpt & 3U) != 3 && ((duplicatedTimeOpt & 0xcU) != 4)))) goto LAB_001f6e3e;
  }
  else if (((nonExistingTimeOpt & 3U) != 1) &&
          ((bVar1 = true, (nonExistingTimeOpt & 3U) == 3 || ((~nonExistingTimeOpt & 0xcU) == 0))))
  goto LAB_001f6e3e;
  iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xd])(this);
  local_70 = date - (double)iVar2;
  bVar1 = false;
LAB_001f6e3e:
  if (!bVar1) {
    dVar5 = uprv_floor_63(local_70 / 86400000.0);
    Grego::dayToFields(dVar5,&year,&month,&dom,&dow,&doy_unused);
    iVar2 = 0;
    if ((year & 3U) == 0) {
      uVar4 = year * -0x3d70a3d7 + 0x51eb850;
      iVar2 = 0xc;
      if ((uVar4 >> 2 | year * 0x40000000) < 0x28f5c29) {
        iVar2 = 0xc;
        if (0xa3d70a < (uVar4 >> 4 | year * -0x70000000)) {
          iVar2 = 0;
        }
      }
    }
    iVar2 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[5])
                      (this,1,(ulong)(uint)year,(ulong)(uint)month,(ulong)(uint)dom,(ulong)(byte)dow
                       ,(ulong)(uint)(int)(local_70 - dVar5 * 86400000.0),
                       (ulong)(uint)(int)(char)Grego::MONTH_LENGTH[iVar2 + month],status);
    *local_40 = iVar2 - *local_48;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }